

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.h
# Opt level: O3

Vec3 __thiscall ImageTexture::GetValue(ImageTexture *this,float u,float v,Vec3 *pos)

{
  ushort uVar1;
  long lVar2;
  undefined4 in_ECX;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined1 in_register_00001204 [12];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Vec3 VVar16;
  undefined1 auVar8 [16];
  int iVar11;
  undefined1 auVar12 [16];
  
  iVar11 = (int)*(undefined8 *)(pos->e + 2);
  fVar10 = (float)iVar11;
  fVar15 = (float)(int)((ulong)*(undefined8 *)(pos->e + 2) >> 0x20);
  auVar6._0_4_ = u * fVar10;
  auVar6._4_12_ = in_register_00001204;
  auVar8._0_8_ = auVar6._0_8_;
  auVar8._8_4_ = in_register_00001204._0_4_;
  auVar8._12_4_ = fVar15;
  auVar7._8_8_ = auVar8._8_8_;
  auVar7._4_4_ = fVar15 * (1.0 - v) + -0.001;
  auVar7._0_4_ = auVar6._0_4_;
  auVar9._4_4_ = fVar15 + -1.0;
  auVar9._0_4_ = fVar10 + -1.0;
  auVar9._8_8_ = 0;
  auVar9 = minps(auVar7,auVar9);
  iVar4 = -(uint)(0.0 < auVar9._0_4_);
  iVar5 = -(uint)(0.0 < auVar9._4_4_);
  auVar13._4_4_ = iVar5;
  auVar13._0_4_ = iVar4;
  auVar13._8_4_ = iVar5;
  auVar13._12_4_ = iVar5;
  auVar12._8_8_ = auVar13._8_8_;
  auVar12._4_4_ = iVar4;
  auVar12._0_4_ = iVar4;
  uVar3 = movmskpd(in_ECX,auVar12);
  iVar4 = (int)auVar9._0_4_;
  if ((uVar3 & 1) == 0) {
    iVar4 = 0;
  }
  iVar5 = (int)auVar9._4_4_;
  if ((uVar3 & 2) == 0) {
    iVar5 = 0;
  }
  lVar2 = (long)((iVar11 * iVar5 + iVar4) * 3);
  VVar16.e[0] = (float)*(byte *)(*(long *)(pos[1].e + 1) + 2 + lVar2) / 255.0;
  uVar1 = *(ushort *)(*(long *)(pos[1].e + 1) + lVar2);
  auVar14._0_4_ = (float)(uVar1 & 0xff);
  auVar14._4_4_ = (float)(byte)(uVar1 >> 8);
  auVar14._8_8_ = 0;
  auVar9 = divps(auVar14,_DAT_0011c1b0);
  (this->super_Texture)._vptr_Texture = auVar9._0_8_;
  this->m_width = (int)VVar16.e[0];
  VVar16.e[1] = 0.0;
  VVar16.e[2] = auVar9._0_4_;
  return (Vec3)VVar16.e;
}

Assistant:

virtual Vec3 GetValue(float u, float v, const Vec3& pos) const override {
		int   _i		= (int)std::max(0.0f, std::min(m_width  - 1.0f, (u)*m_width));
		int   _j		= (int)std::max(0.0f, std::min(m_height - 1.0f, (1.0f - v)*m_height - 0.001f));

		int	  _i3       = _i * 3;
		int	  _j3_width = _j * 3 * m_width;
		float _r		= int(m_data[_i3 + _j3_width]    ) / 255.0f;
		float _g		= int(m_data[_i3 + _j3_width + 1]) / 255.0f;
		float _b		= int(m_data[_i3 + _j3_width + 2]) / 255.0f;

		return Vec3(_r, _g, _b);
	}